

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> __thiscall
FBX::Parser::parseScene(Parser *this)

{
  long lVar1;
  long lVar2;
  element_type *peVar3;
  size_type sVar4;
  undefined1 auVar5 [8];
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  bool bVar9;
  Texture *this_00;
  Material *this_01;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar10;
  __uniq_ptr_data<FBX::Scene,_std::default_delete<FBX::Scene>,_true,_true> this_02;
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar11;
  shared_ptr<FBX::Texture> *texture;
  Node *pNVar12;
  _Alloc_hider _Var13;
  pointer psVar14;
  __shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2> *p_Var15;
  vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *__range3;
  Node *in_RSI;
  pointer pNVar16;
  shared_ptr<FBX::Material> *material;
  _Base_ptr p_Var17;
  shared_ptr<FBX::Model> *model_1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float in_XMM1_Da;
  Vector3 up;
  string local_248;
  Node *local_220;
  undefined1 local_218 [8];
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeModels;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> models;
  vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_> local_1d8
  ;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeTextures;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeMaterials;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> meshes;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeGeometry;
  value_type nodeConnections;
  value_type nodeObjects;
  Settings settings;
  
  pNVar12 = (Node *)in_RSI->propertyCount;
  local_220 = in_RSI;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nodeObjects,"GlobalSettings",(allocator<char> *)&local_248);
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)&nodeConnections,pNVar12,
            (string *)&nodeObjects);
  Settings::Settings(&settings,(Node *)nodeConnections.propertyCount);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)&nodeConnections);
  std::__cxx11::string::~string((string *)&nodeObjects);
  pNVar12 = (Node *)local_220->propertyCount;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nodeConnections,"Objects",(allocator<char> *)&nodeModels);
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)&local_248,pNVar12,
            (string *)&nodeConnections);
  Node::Node(&nodeObjects,(Node *)local_248._M_dataplus._M_p);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)&local_248);
  std::__cxx11::string::~string((string *)&nodeConnections);
  pNVar12 = (Node *)local_220->propertyCount;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Connections",(allocator<char> *)&nodeGeometry);
  findNodes(&nodeModels,pNVar12,&local_248);
  Node::Node(&nodeConnections,
             nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&nodeModels);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Model",(allocator<char> *)&nodeGeometry);
  findNodes(&nodeModels,&nodeObjects,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Geometry",(allocator<char> *)&nodeMaterials);
  findNodes(&nodeGeometry,&nodeObjects,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Material",(allocator<char> *)&nodeTextures);
  findNodes(&nodeMaterials,&nodeObjects,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Texture",(allocator<char> *)&local_1d8);
  findNodes(&nodeTextures,&nodeObjects,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  local_248._M_dataplus._M_p = (pointer)0x0;
  local_248._M_string_length = 0;
  local_248.field_2._M_allocated_capacity = 0;
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  reserve((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *)
          &local_248,
          ((long)nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x60);
  for (; nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
         super__Vector_impl_data._M_start !=
         nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
      nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start =
           nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    this_00 = (Texture *)operator_new(0x48);
    Texture::Texture(this_00,nodeTextures.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    local_1d8.
    super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    std::vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>::
    emplace_back<FBX::Texture*>
              ((vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>
                *)&local_248,(Texture **)&local_1d8);
  }
  local_1d8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  reserve(&local_1d8,
          ((long)nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x60);
  for (; nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
         super__Vector_impl_data._M_start !=
         nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
      nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start =
           nodeMaterials.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    this_01 = (Material *)operator_new(0xc0);
    Material::Material(this_01,nodeMaterials.
                               super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                               super__Vector_impl_data._M_start);
    meshes.
    super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
    std::vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>::
    emplace_back<FBX::Material*>
              ((vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>
                *)&local_1d8,(Material **)&meshes);
  }
  meshes.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  meshes.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  meshes.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pNVar16 = nodeGeometry.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pNVar16 !=
      nodeGeometry.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish; pNVar16 = pNVar16 + 1) {
    pvVar10 = std::
              get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                        ((pNVar16->properties).
                         super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
    bVar9 = std::operator==(pvVar10,"Mesh");
    if (bVar9) {
      up.y = (float)extraout_XMM0_Db;
      up.x = (float)extraout_XMM0_Da;
      up.z = in_XMM1_Da;
      parseMesh((Parser *)&models,local_220,up);
      std::vector<std::shared_ptr<FBX::Mesh>,std::allocator<std::shared_ptr<FBX::Mesh>>>::
      emplace_back<std::shared_ptr<FBX::Mesh>>
                ((vector<std::shared_ptr<FBX::Mesh>,std::allocator<std::shared_ptr<FBX::Mesh>>> *)
                 &meshes,(shared_ptr<FBX::Mesh> *)&models);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &models.
                  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  models.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  models.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  models.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::reserve
            (&models,((long)nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x60);
  for (pNVar16 = nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pNVar12 = nodeConnections.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>.
                _M_impl.super__Vector_impl_data._M_start,
      pNVar16 !=
      nodeModels.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish; pNVar16 = pNVar16 + 1) {
    pvVar10 = std::
              get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                        ((pNVar16->properties).
                         super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
    bVar9 = std::operator==(pvVar10,"Mesh");
    if (bVar9) {
      this_02.super___uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_>._M_t.
      super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
      super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl =
           (__uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_>)operator_new(0x28);
      Model::Model((Model *)this_02.
                            super___uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_>._M_t
                            .super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
                            super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl,pNVar16);
      local_218 = (undefined1  [8])
                  this_02.super___uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_>._M_t.
                  super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
                  super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl;
      std::vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>::
      emplace_back<FBX::Model*>
                ((vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>> *)
                 &models,(Model **)local_218);
    }
  }
  while (pNVar12 !=
         nodeConnections.children.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    pvVar11 = std::
              get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                        ((pNVar12->properties).
                         super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    lVar1 = *pvVar11;
    local_220 = pNVar12;
    pvVar11 = std::
              get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                        ((pNVar12->properties).
                         super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
    psVar7 = local_1d8.
             super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar2 = *pvVar11;
    for (p_Var17 = (_Base_ptr)
                   local_1d8.
                   super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        psVar8 = meshes.
                 super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, sVar4 = local_248._M_string_length,
        p_Var15 = &(meshes.
                    super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>,
        _Var13._M_p = local_248._M_dataplus._M_p, p_Var17 != (_Base_ptr)psVar7;
        p_Var17 = (_Base_ptr)&p_Var17->_M_left) {
      for (; psVar6 = models.
                      super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          psVar14 = models.
                    super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, _Var13._M_p != (pointer)sVar4;
          _Var13._M_p = (pointer)((long)_Var13._M_p + 0x10)) {
        if ((lVar1 == (((__shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2> *)_Var13._M_p)->
                       _M_ptr->super_Object).id) &&
           (lVar2 == ((*(element_type **)&p_Var17->_M_color)->super_Object).id)) {
          std::__shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((*(element_type **)&p_Var17->_M_color)->texture).
                      super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2> *)_Var13._M_p);
        }
      }
      for (; psVar14 != psVar6; psVar14 = psVar14 + 1) {
        if ((lVar1 == ((*(element_type **)&p_Var17->_M_color)->super_Object).id) &&
           (peVar3 = (psVar14->super___shared_ptr<FBX::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
           lVar2 == (peVar3->super_Object).id)) {
          std::__shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar3->material).
                      super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2> *)p_Var17);
        }
      }
    }
    for (; psVar6 = models.
                    super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        psVar14 = models.
                  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        p_Var15 != &psVar8->super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>;
        p_Var15 = p_Var15 + 1) {
      for (; psVar14 != psVar6; psVar14 = psVar14 + 1) {
        if ((lVar1 == (p_Var15->_M_ptr->super_Object).id) &&
           (peVar3 = (psVar14->super___shared_ptr<FBX::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
           lVar2 == (peVar3->super_Object).id)) {
          std::__shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar3->mesh).super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>,
                     p_Var15);
        }
      }
    }
    pNVar12 = local_220 + 1;
  }
  std::
  make_unique<FBX::Scene,std::vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>&,FBX::Settings&>
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             local_218,(Settings *)&models);
  auVar5 = local_218;
  local_218 = (undefined1  [8])0x0;
  this->root = (Node *)auVar5;
  std::unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_>::~unique_ptr
            ((unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_> *)local_218);
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::~vector
            (&models);
  std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::~vector
            (&meshes);
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  ~vector(&local_1d8);
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  ~vector((vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> *)
          &local_248);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&nodeTextures);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&nodeMaterials);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&nodeGeometry);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&nodeModels);
  Node::~Node(&nodeConnections);
  Node::~Node(&nodeObjects);
  return (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)
         (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)this;
}

Assistant:

std::unique_ptr<const Scene> Parser::parseScene() const {
        Settings settings(findNodes(root, "GlobalSettings")[0]);

        const auto nodeObjects = findNodes(root, "Objects")[0];
        const auto nodeConnections = findNodes(root, "Connections")[0];
        const auto nodeModels = findNodes(nodeObjects, "Model");
        const auto nodeGeometry = findNodes(nodeObjects, "Geometry");
        const auto nodeMaterials = findNodes(nodeObjects, "Material");
        const auto nodeTextures = findNodes(nodeObjects, "Texture");

        std::vector<std::shared_ptr<Texture>> textures{};
        textures.reserve(nodeTextures.size());
        for (const auto &node : nodeTextures)
            textures.emplace_back(new Texture(node));

        std::vector<std::shared_ptr<Material>> materials{};
        materials.reserve(nodeMaterials.size());
        for (const auto &node : nodeMaterials)
            materials.emplace_back(new Material(node));

        std::vector<std::shared_ptr<Mesh>> meshes;
        for (const auto &node : nodeGeometry)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                meshes.push_back(parseMesh(node, {})); // TODO

        std::vector<std::shared_ptr<Model>> models;
        models.reserve(nodeModels.size());
        for (const auto &node : nodeModels)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                models.emplace_back(new Model(node));

        for (const auto &node : nodeConnections.children) {
            const auto source = std::get<int64_t>(node.properties[1]);
            const auto target = std::get<int64_t>(node.properties[2]);

            for (const auto &material : materials) {
                for (const auto &texture : textures)
                    if (source == texture->id && target == material->id)
                        material->texture = texture;

                for (const auto &model : models)
                    if (source == material->id && target == model->id)
                        model->material = material;
            }

            for (const auto &mesh : meshes)
                for (const auto &model : models)
                    if (source == mesh->id && target == model->id)
                        model->mesh = mesh;
        }

        return std::make_unique<Scene>(models, settings);
    }